

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float64 log_diag_eval(vector_t obs,float32 norm,vector_t mean,vector_t var_fact,uint32 veclen)

{
  uint local_44;
  uint32 l;
  float64 diff;
  float64 d;
  uint32 veclen_local;
  vector_t var_fact_local;
  vector_t mean_local;
  float32 norm_local;
  vector_t obs_local;
  
  diff = 0.0;
  if (veclen == 0x27) {
    for (local_44 = 0; local_44 < 0x27; local_44 = local_44 + 1) {
      diff = (float64)((double)var_fact[local_44] * (double)(obs[local_44] - mean[local_44]) *
                       (double)(obs[local_44] - mean[local_44]) + (double)diff);
    }
  }
  else if (veclen == 0x20) {
    for (local_44 = 0; local_44 < 0x20; local_44 = local_44 + 1) {
      diff = (float64)((double)var_fact[local_44] * (double)(obs[local_44] - mean[local_44]) *
                       (double)(obs[local_44] - mean[local_44]) + (double)diff);
    }
  }
  else {
    for (local_44 = 0; local_44 < veclen; local_44 = local_44 + 1) {
      diff = (float64)((double)var_fact[local_44] * (double)(obs[local_44] - mean[local_44]) *
                       (double)(obs[local_44] - mean[local_44]) + (double)diff);
    }
  }
  return (float64)((double)(float)norm - (double)diff);
}

Assistant:

float64
log_diag_eval(vector_t obs,
	      float32 norm,
	      vector_t mean,
	      vector_t var_fact,
	      uint32 veclen)
{
    float64 d = 0.0, diff;
    uint32 l;

    if (veclen == 39) {
	/* Most common case, optimized for loop unrolling */
        for (l = 0; l < 39; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    } else if (veclen == 32) {
	/* Most common case, optimized for loop unrolling */
        for (l = 0; l < 32; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    } else {
        for (l = 0; l < veclen; l++) {
	    diff = obs[l] - mean[l];
	    d += var_fact[l] * diff * diff;	/* compute -1 / (2 sigma ^2) * (x - m) ^ 2 terms */
	}
    }
    
    return norm - d;	/* log (1 / 2 pi |sigma^2|) */
}